

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

HelicsIterationResult
helicsFederateEnterExecutingModeIterative
          (HelicsFederate fed,HelicsIterationRequest iterate,HelicsError *err)

{
  IterationRequest iterate_00;
  IterationResult IVar1;
  Federate *this;
  HelicsIterationResult HVar2;
  
  this = getFed(fed,err);
  HVar2 = HELICS_ITERATION_RESULT_ERROR;
  if (this != (Federate *)0x0) {
    iterate_00 = anon_unknown.dwarf_5d555::getIterationRequest(iterate);
    IVar1 = helics::Federate::enterExecutingMode(this,iterate_00);
    if (IVar1 < 4) {
      HVar2 = *(HelicsIterationResult *)(&DAT_0037b6b0 + (ulong)IVar1 * 4);
    }
  }
  return HVar2;
}

Assistant:

HelicsIterationResult helicsFederateEnterExecutingModeIterative(HelicsFederate fed, HelicsIterationRequest iterate, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return HELICS_ITERATION_RESULT_ERROR;
    }
    try {
        auto val = fedObj->enterExecutingMode(getIterationRequest(iterate));
        return getIterationStatus(val);
    }
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_ITERATION_RESULT_ERROR;
    }
}